

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutlineHandler.cpp
# Opt level: O3

void __thiscall
OutlineHandler::run(OutlineHandler *this,Id *id,
                   optional<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                   *paramsOpt)

{
  pointer pDVar1;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  Type this_01;
  Ch *__s;
  File *file;
  DocumentSymbol *symbol;
  pointer this_02;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *__range1;
  string uri;
  vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> local_c8;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  local_a8;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_68;
  string local_38;
  
  if (paramsOpt->is_some == false) {
    sendError(id,InvalidParams,"missing params",(Value *)0x0);
    return;
  }
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)paramsOpt,"textDocument");
  this_01 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>(this_00,"uri");
  __s = rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GetString(this_01);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,__s,(allocator<char> *)&local_a8);
  file = FileManager::get(&local_38);
  if (file == (File *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"!!! Null file !!!\n",0x12);
    sendNullResult(id);
    goto LAB_0019a167;
  }
  local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (file->type == Bib) {
    getOutlineForBibFile((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_68,file);
LAB_00199fd0:
    local_a8.level_stack_.ownAllocator_ =
         (CrtAllocator *)
         local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_a8.level_stack_.allocator_ =
         (CrtAllocator *)
         local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_a8.os_ = (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                   local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_68.stack_.stack_;
    local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_68.stack_.allocator_;
    local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_68.stack_.ownAllocator_;
    local_68.stack_.allocator_ = (CrtAllocator *)0x0;
    local_68.stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_68.stack_.stack_ = (char *)0x0;
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
              ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_a8);
    std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector
              ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_68);
    local_a8.os_ = &local_68;
    local_68.stack_.stack_ = (char *)0x0;
    local_68.stack_.stackTop_ = (char *)0x0;
    local_68.stack_.allocator_ = (CrtAllocator *)0x0;
    local_68.stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_68.stack_.stackEnd_ = (char *)0x0;
    local_68.stack_.initialCapacity_ = 0x100;
    local_a8.level_stack_.allocator_ = (CrtAllocator *)0x0;
    local_a8.level_stack_.ownAllocator_ = (CrtAllocator *)0x0;
    local_a8.level_stack_.stack_ = (char *)0x0;
    local_a8.level_stack_.stackTop_ = (char *)0x0;
    local_a8.level_stack_.stackEnd_ = (char *)0x0;
    local_a8.level_stack_.initialCapacity_ = 0x200;
    local_a8.maxDecimalPlaces_ = 0x144;
    local_a8.hasRoot_ = false;
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(&local_a8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_a8,"jsonrpc",7,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_a8,"2.0",3,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_a8,"id",2,false);
    Id::writeId(id,&local_a8);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(&local_a8,"result",6,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartArray(&local_a8);
    pDVar1 = local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_02 = local_c8.super__Vector_base<DocumentSymbol,_std::allocator<DocumentSymbol>_>._M_impl
                .super__Vector_impl_data._M_start;
      do {
        DocumentSymbol::reflect((DocumentSymbol *)this_02,&local_a8);
        this_02 = this_02 + 1;
      } while (this_02 != pDVar1);
    }
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndArray(&local_a8,0);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(&local_a8,0);
    sendMessage(&local_68);
    free(local_a8.level_stack_.stack_);
    operator_delete(local_a8.level_stack_.ownAllocator_,1);
    free(local_68.stack_.stack_);
    operator_delete(local_68.stack_.ownAllocator_,1);
  }
  else {
    if (file->type == Tex) {
      getOutlineForLatexFile
                ((vector<DocumentSymbol,_std::allocator<DocumentSymbol>_> *)&local_68,file);
      goto LAB_00199fd0;
    }
    sendNullResult(id);
  }
  std::vector<DocumentSymbol,_std::allocator<DocumentSymbol>_>::~vector(&local_c8);
LAB_0019a167:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OutlineHandler::run (Id &id, optional<Value> &paramsOpt) {
    if (!paramsOpt) {
        sendError(&id, ResponseHandler::ErrorCode::InvalidParams, "missing params");
        return;
    }

    Value &params = *paramsOpt; // TODO: Make function

    Value &textDocumentIdentifier = params["textDocument"];
    string uri = textDocumentIdentifier["uri"].GetString();

    File *file = FileManager::get(uri);
    if (file == nullptr) {
        std::cerr << "!!! Null file !!!\n";
        sendNullResult(id);
        return;
    }

    vector<DocumentSymbol> symbols;
    switch (file->type) {
        case File::Type::Tex:
            symbols = getOutlineForLatexFile(*file);
            break;
        case File::Type::Bib:
            symbols = getOutlineForBibFile(*file);
            break;
        default:
            sendNullResult(id);
            return;
    }

    INIT_WRITER
    ADD_ID(id);
    writer.Key("result");
    writer.StartArray();
    for (auto &symbol : symbols) {
        symbol.reflect(writer);
    }
    writer.EndArray();
    SEND_MESSAGE
}